

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanio.c
# Opt level: O2

void Abc_ObjReplaceByConstant(Abc_Obj_t *pNode,int fConst1)

{
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pNodeTo;
  
  pNtk = pNode->pNtk;
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNode->pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                  ,0x160,"void Abc_ObjReplaceByConstant(Abc_Obj_t *, int)");
  }
  if ((*(uint *)&pNode->field_0x14 & 0xf) - 5 < 0xfffffffe) {
    if (fConst1 == 0) {
      pNodeTo = Abc_NtkCreateNodeConst0(pNtk);
    }
    else {
      pNodeTo = Abc_NtkCreateNodeConst1(pNtk);
    }
    Abc_ObjTransferFanout(pNode,pNodeTo);
    if ((*(uint *)&pNode->field_0x14 & 0xf) == 7) {
      Abc_NtkDeleteObj_rec(pNode,1);
      return;
    }
    return;
  }
  __assert_fail("!Abc_ObjIsCo(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                ,0x161,"void Abc_ObjReplaceByConstant(Abc_Obj_t *, int)");
}

Assistant:

void Abc_ObjReplaceByConstant( Abc_Obj_t * pNode, int fConst1 )
{
    Abc_Obj_t * pNodeNew;
    assert( Abc_NtkIsLogic(pNode->pNtk) );
    assert( !Abc_ObjIsCo(pNode) );
    pNodeNew = fConst1 ? Abc_NtkCreateNodeConst1(pNode->pNtk) : Abc_NtkCreateNodeConst0(pNode->pNtk);
    // transfer the fanouts to the old node
    Abc_ObjTransferFanout( pNode, pNodeNew );
    // remove the old node
    if ( Abc_ObjIsNode(pNode) )
        Abc_NtkDeleteObj_rec( pNode, 1 );
}